

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

QString * fitEntryTypeToUString(QString *__return_storage_ptr__,UINT8 type)

{
  UINT8 type_local;
  
  switch(type & 0x7f) {
  case 0:
    QString::QString(__return_storage_ptr__,"FIT Header");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Microcode");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Startup ACM");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Diagnostic ACM");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"Platform Boot Policy");
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)(type & 0x7f));
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"FIT Reset State");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"BIOS Startup Module");
    break;
  case 8:
    QString::QString(__return_storage_ptr__,"TPM Policy");
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"BIOS Policy");
    break;
  case 10:
    QString::QString(__return_storage_ptr__,"TXT Policy");
    break;
  case 0xb:
    QString::QString(__return_storage_ptr__,"BootGuard Key Manifest");
    break;
  case 0xc:
    QString::QString(__return_storage_ptr__,"BootGuard Boot Policy");
    break;
  case 0x10:
    QString::QString(__return_storage_ptr__,"CSE SecureBoot Settings");
    break;
  case 0x1a:
    QString::QString(__return_storage_ptr__,"VAB Provisioning Table");
    break;
  case 0x1b:
    QString::QString(__return_storage_ptr__,"VAB Key Manifest");
    break;
  case 0x1c:
    QString::QString(__return_storage_ptr__,"VAB Image Manifest");
    break;
  case 0x1d:
    QString::QString(__return_storage_ptr__,"VAB Image Hash Descriptors");
    break;
  case 0x2c:
    QString::QString(__return_storage_ptr__,"SACM Debug Record");
    break;
  case 0x2d:
    QString::QString(__return_storage_ptr__,"ACM Feature Policy");
    break;
  case 0x2e:
    QString::QString(__return_storage_ptr__,"SCRTM Error Record");
    break;
  case 0x2f:
    QString::QString(__return_storage_ptr__,"JMP Debug Policy");
    break;
  case 0x7f:
    QString::QString(__return_storage_ptr__,"Empty");
  }
  return __return_storage_ptr__;
}

Assistant:

UString fitEntryTypeToUString(const UINT8 type)
{
    switch (type & 0x7F) {
        case INTEL_FIT_TYPE_HEADER:                     return UString("FIT Header");
        case INTEL_FIT_TYPE_MICROCODE:                  return UString("Microcode");
        case INTEL_FIT_TYPE_STARTUP_AC_MODULE:          return UString("Startup ACM");
        case INTEL_FIT_TYPE_DIAG_AC_MODULE:             return UString("Diagnostic ACM");
        case INTEL_FIT_TYPE_PLATFORM_BOOT_POLICY:       return UString("Platform Boot Policy");
        case INTEL_FIT_TYPE_FIT_RESET_STATE:            return UString("FIT Reset State");
        case INTEL_FIT_TYPE_BIOS_STARTUP_MODULE:        return UString("BIOS Startup Module");
        case INTEL_FIT_TYPE_TPM_POLICY:                 return UString("TPM Policy");
        case INTEL_FIT_TYPE_BIOS_POLICY:                return UString("BIOS Policy");
        case INTEL_FIT_TYPE_TXT_POLICY:                 return UString("TXT Policy");
        case INTEL_FIT_TYPE_BOOT_GUARD_KEY_MANIFEST:    return UString("BootGuard Key Manifest");
        case INTEL_FIT_TYPE_BOOT_GUARD_BOOT_POLICY:     return UString("BootGuard Boot Policy");
        case INTEL_FIT_TYPE_CSE_SECURE_BOOT:            return UString("CSE SecureBoot Settings");
        case INTEL_FIT_TYPE_VAB_PROVISIONING_TABLE:     return UString("VAB Provisioning Table");
        case INTEL_FIT_TYPE_VAB_KEY_MANIFEST:           return UString("VAB Key Manifest");
        case INTEL_FIT_TYPE_VAB_IMAGE_MANIFEST:         return UString("VAB Image Manifest");
        case INTEL_FIT_TYPE_VAB_IMAGE_HASH_DESCRIPTORS: return UString("VAB Image Hash Descriptors");
        case INTEL_FIT_TYPE_SACM_DEBUG_RECORD:          return UString("SACM Debug Record");
        case INTEL_FIT_TYPE_ACM_FEATURE_POLICY:         return UString("ACM Feature Policy");
        case INTEL_FIT_TYPE_SCRTM_ERROR_RECORD:         return UString("SCRTM Error Record");
        case INTEL_FIT_TYPE_JMP_DEBUG_POLICY:           return UString("JMP Debug Policy");
        case INTEL_FIT_TYPE_EMPTY:                      return UString("Empty");
    }
    
    return usprintf("Unknown %02Xh", (type & 0x7F));
}